

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
array<CDoodadsMapper::CRuleSet,_allocator_default<CDoodadsMapper::CRuleSet>_>::alloc
          (array<CDoodadsMapper::CRuleSet,_allocator_default<CDoodadsMapper::CRuleSet>_> *this,
          int new_len)

{
  CRuleSet *pCVar1;
  uint uVar2;
  int iVar3;
  CRuleSet *pCVar4;
  long lVar5;
  char *pcVar6;
  array<CDoodadsMapper::CRule,_allocator_default<CDoodadsMapper::CRule>_> *paVar7;
  long lVar8;
  array<CDoodadsMapper::CRule,_allocator_default<CDoodadsMapper::CRule>_> *this_00;
  byte bVar9;
  
  bVar9 = 0;
  this->list_size = new_len;
  pCVar4 = allocator_default<CDoodadsMapper::CRuleSet>::alloc_array(new_len);
  uVar2 = this->list_size;
  if (this->num_elements < this->list_size) {
    uVar2 = this->num_elements;
  }
  if (0 < (int)uVar2) {
    this_00 = &pCVar4->m_aRules;
    lVar8 = 0;
    do {
      pCVar1 = this->list;
      pcVar6 = pCVar1->m_aName + lVar8;
      paVar7 = this_00 + -8;
      for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
        paVar7->list = *(CRule **)pcVar6;
        pcVar6 = pcVar6 + ((ulong)bVar9 * -2 + 1) * 8;
        paVar7 = (array<CDoodadsMapper::CRule,_allocator_default<CDoodadsMapper::CRule>_> *)
                 &paVar7[-(ulong)bVar9].list_size;
      }
      array<CDoodadsMapper::CRule,_allocator_default<CDoodadsMapper::CRule>_>::operator=
                (this_00,(array<CDoodadsMapper::CRule,_allocator_default<CDoodadsMapper::CRule>_> *)
                         (pCVar1->m_aName + lVar8 + 0x80));
      this_00 = this_00 + 9;
      lVar8 = lVar8 + 0x90;
    } while ((ulong)uVar2 * 0x90 != lVar8);
  }
  allocator_default<CDoodadsMapper::CRuleSet>::free_array(this->list);
  iVar3 = this->list_size;
  if (this->num_elements < this->list_size) {
    iVar3 = this->num_elements;
  }
  this->num_elements = iVar3;
  this->list = pCVar4;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}